

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

Vec_Vec_t * Gia_ManDeriveCiTfo(Gia_Man_t *p)

{
  long lVar1;
  uint uVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  Gia_ManCleanMark0(p);
  Gia_ManIncrementTravId(p);
  pVVar5 = p->vCis;
  uVar2 = pVVar5->nSize;
  pVVar3 = (Vec_Vec_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar2 - 1) {
    uVar7 = (ulong)uVar2;
  }
  pVVar3->nSize = 0;
  iVar6 = (int)uVar7;
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < (int)uVar2) {
    lVar8 = 0;
    do {
      iVar6 = pVVar5->pArray[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pVVar5 = Gia_ManDeriveCiTfoOne(p,p->pObjs + iVar6);
      iVar6 = (int)uVar7;
      if ((int)lVar8 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,uVar7 * 8);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      lVar1 = lVar8 + 1;
      pVVar3->nSize = (int)lVar1;
      ppvVar4[lVar8] = pVVar5;
      pVVar5 = p->vCis;
      lVar8 = lVar1;
    } while (lVar1 < pVVar5->nSize);
  }
  Gia_ManCleanMark0(p);
  return pVVar3;
}

Assistant:

Vec_Vec_t * Gia_ManDeriveCiTfo( Gia_Man_t * p )
{
    Vec_Ptr_t * vRes;
    Gia_Obj_t * pPivot;
    int i;
    Gia_ManCleanMark0( p );
    Gia_ManIncrementTravId( p );
    vRes = Vec_PtrAlloc( Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pPivot, i )
        Vec_PtrPush( vRes, Gia_ManDeriveCiTfoOne(p, pPivot) );
    Gia_ManCleanMark0( p );
    return (Vec_Vec_t *)vRes;
}